

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitCastExpression(SyntaxDumper *this,CastExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  traverseExpression(this,&node->super_ExpressionSyntax);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->typeName_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  return Skip;
}

Assistant:

virtual Action visitCastExpression(const CastExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->typeName());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->expression());
        return Action::Skip;
    }